

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

Amount __thiscall cfd::TransactionContext::GetFeeAmount(TransactionContext *this)

{
  AbstractTxIn *pAVar1;
  AbstractTxOut *pAVar2;
  void *pvVar3;
  bool bVar4;
  uint32_t vout;
  int64_t iVar5;
  CfdException *this_00;
  undefined8 extraout_RDX;
  TxOut *txout_ref;
  AbstractTxIn *this_01;
  AbstractTxOut *this_02;
  Amount AVar6;
  Amount output;
  Amount input;
  UtxoData utxo;
  undefined1 local_5c8 [16];
  _func_int *local_5b8 [2];
  Amount local_5a8;
  OutPoint local_590;
  Amount local_568;
  UtxoData local_558;
  
  core::Amount::Amount(&local_568);
  UtxoData::UtxoData(&local_558);
  this_01 = &((this->super_Transaction).vin_.
              super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxIn;
  pAVar1 = &((this->super_Transaction).vin_.
             super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  if (this_01 != pAVar1) {
    do {
      core::AbstractTxIn::GetTxid((Txid *)local_5c8,this_01);
      vout = core::AbstractTxIn::GetVout(this_01);
      core::OutPoint::OutPoint(&local_590,(Txid *)local_5c8,vout);
      local_5c8._0_8_ = &PTR__Txid_0087c9b8;
      pvVar3 = (void *)CONCAT71(local_5c8._9_7_,local_5c8[8]);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_5b8[1] - (long)pvVar3);
      }
      bVar4 = IsFindUtxoMap(this,&local_590,&local_558);
      if (!bVar4) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_5c8._0_8_ = local_5b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5c8,"Utxo is not found. GetFeeAmount fail.","");
        core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_5c8);
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::Amount::operator+=(&local_568,&local_558.amount);
      local_590.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_590.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_590.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_590.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_590.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pAVar1);
  }
  core::Amount::Amount((Amount *)&local_590);
  this_02 = &((this->super_Transaction).vout_.
              super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxOut;
  pAVar2 = &((this->super_Transaction).vout_.
             super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
             super__Vector_impl_data._M_finish)->super_AbstractTxOut;
  if (this_02 != pAVar2) {
    do {
      AVar6 = core::AbstractTxOut::GetValue(this_02);
      local_5c8._0_8_ = AVar6.amount_;
      local_5c8[8] = AVar6.ignore_check_;
      core::Amount::operator+=((Amount *)&local_590,(Amount *)local_5c8);
      this_02 = this_02 + 1;
    } while (this_02 != pAVar2);
  }
  AVar6 = core::operator-(&local_568,(Amount *)&local_590);
  local_5c8._0_8_ = AVar6.amount_;
  local_5c8[8] = AVar6.ignore_check_;
  iVar5 = core::Amount::GetSatoshiValue((Amount *)local_5c8);
  if (iVar5 < 0) {
    core::Amount::Amount(&local_5a8);
  }
  else {
    local_5a8._9_7_ = local_5c8._9_7_;
    local_5a8.ignore_check_ = local_5c8[8];
    local_5a8.amount_ = local_5c8._0_8_;
  }
  UtxoData::~UtxoData(&local_558);
  AVar6._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar6.ignore_check_ = local_5a8.ignore_check_;
  AVar6.amount_ = local_5a8.amount_;
  return AVar6;
}

Assistant:

Amount TransactionContext::GetFeeAmount() const {
  Amount input;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. GetFeeAmount fail.");
    }
    input += utxo.amount;
  }

  Amount output;
  for (const auto& txout_ref : vout_) {
    output += txout_ref.GetValue();
  }
  Amount result = input - output;
  if (result.GetSatoshiValue() < 0) {
    return Amount();
  }
  return result;
}